

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int idaLsDQJtimes(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,N_Vector v,N_Vector Jv,
                 sunrealtype c_j,void *ida_mem,N_Vector work1,N_Vector work2)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  IDALsMem idals_mem;
  IDAMem local_68;
  N_Vector local_60;
  N_Vector local_58;
  N_Vector local_50;
  sunrealtype local_48;
  sunrealtype local_40;
  IDALsMem local_38;
  
  local_48 = tt;
  local_40 = c_j;
  iVar1 = idaLs_AccessLMem(ida_mem,"idaLsDQJtimes",&local_68,&local_38);
  if (iVar1 == 0) {
    local_60 = rr;
    iVar1 = SUNLinSolGetID(local_38->LS);
    local_58 = yy;
    local_50 = yp;
    if (iVar1 - 7U < 2) {
      dVar4 = local_38->nrmfac * local_38->dqincfac;
    }
    else {
      dVar4 = local_38->dqincfac;
      dVar3 = (double)N_VWrmsNorm(v,local_68->ida_ewt);
      dVar4 = dVar4 / dVar3;
    }
    iVar1 = 3;
    do {
      N_VLinearSum(dVar4,0x3ff0000000000000,v,local_58,work1);
      N_VLinearSum(dVar4 * local_40,0x3ff0000000000000,v,local_50,work2);
      iVar2 = (*local_38->jt_res)(local_48,work1,work2,Jv,local_68->ida_user_data);
      local_38->nreDQ = local_38->nreDQ + 1;
      if (iVar2 == 0) break;
      if (iVar2 < 0) {
        return -1;
      }
      dVar4 = dVar4 * 0.25;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 1;
    if (iVar2 == 0) {
      N_VLinearSum(1.0 / dVar4,-(1.0 / dVar4),Jv,local_60,Jv);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int idaLsDQJtimes(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector rr,
                  N_Vector v, N_Vector Jv, sunrealtype c_j, void* ida_mem,
                  N_Vector work1, N_Vector work2)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  N_Vector y_tmp, yp_tmp;
  sunrealtype sig, siginv;
  int iter, retval;
  SUNLinearSolver_ID LSID;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  LSID = SUNLinSolGetID(idals_mem->LS);
  if (LSID == SUNLINEARSOLVER_SPGMR || LSID == SUNLINEARSOLVER_SPFGMR)
  {
    sig = idals_mem->nrmfac * idals_mem->dqincfac;
  }
  else { sig = idals_mem->dqincfac / N_VWrmsNorm(v, IDA_mem->ida_ewt); }

  /* Rename work1 and work2 for readibility */
  y_tmp  = work1;
  yp_tmp = work2;

  for (iter = 0; iter < MAX_ITERS; iter++)
  {
    /* Set y_tmp = yy + sig*v, yp_tmp = yp + cj*sig*v. */
    N_VLinearSum(sig, v, ONE, yy, y_tmp);
    N_VLinearSum(c_j * sig, v, ONE, yp, yp_tmp);

    /* Call res for Jv = F(t, y_tmp, yp_tmp), and return if it failed. */
    retval = idals_mem->jt_res(tt, y_tmp, yp_tmp, Jv, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    sig *= PT25;
  }

  if (retval > 0) { return (+1); }

  /* Set Jv to [Jv - rr]/sig and return. */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, rr, Jv);

  return (0);
}